

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O0

bool __thiscall AudioLogger::addFrame(AudioLogger *this,Sample *stream)

{
  EAudioFilter EVar1;
  bool bVar2;
  uint uVar3;
  Data *pDVar4;
  reference pvVar5;
  iterator pvVar6;
  reference pvVar7;
  size_type sVar8;
  int iVar9;
  long in_RSI;
  TSampleF TVar10;
  int k;
  value_type_conflict3 *nFramesToRecord;
  value_type *record;
  int r;
  lock_guard<std::mutex> lock;
  value_type_conflict1 *s_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  value_type_conflict1 *s;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int j;
  Sample x;
  int i;
  value_type *curFrame;
  float norm;
  Data *data;
  mutex_type *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  value_type *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  value_type_conflict3 in_stack_ffffffffffffff44;
  int local_b0;
  int local_8c;
  TSampleF *local_70;
  TSampleF *local_50;
  int local_3c;
  float local_38;
  int local_34;
  bool local_1;
  
  pDVar4 = getData((AudioLogger *)0x1b0c84);
  bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff38);
  if (bVar2) {
    uVar3 = SDL_GetQueuedAudioSize(pDVar4->deviceIdIn);
    if (0x10000 < uVar3) {
      uVar3 = SDL_GetQueuedAudioSize(pDVar4->deviceIdIn);
      printf("Queue size: %d\n",(ulong)uVar3);
      SDL_ClearQueuedAudio(pDVar4->deviceIdIn);
    }
    iVar9 = (pDVar4->parameters).nChannels;
    std::array<std::array<float,_512UL>,_939UL>::operator[]
              ((array<std::array<float,_512UL>,_939UL> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (size_type)in_stack_ffffffffffffff28);
    for (local_34 = 0; local_34 < 0x200; local_34 = local_34 + 1) {
      local_38 = 0.0;
      for (local_3c = 0; local_3c < (pDVar4->parameters).nChannels; local_3c = local_3c + 1) {
        local_38 = *(float *)(in_RSI + (long)(local_34 * (pDVar4->parameters).nChannels + local_3c)
                                       * 4) + local_38;
      }
      pvVar5 = std::array<float,_512UL>::operator[]
                         ((array<float,_512UL> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (size_type)in_stack_ffffffffffffff28);
      *pvVar5 = local_38 * (1.0 / (float)iVar9);
    }
    EVar1 = (pDVar4->parameters).filter;
    if (EVar1 != None) {
      if (EVar1 == FirstOrderHighPass) {
        local_50 = std::array<float,_512UL>::begin((array<float,_512UL> *)0x1b0e8f);
        pvVar6 = std::array<float,_512UL>::end((array<float,_512UL> *)0x1b0ea4);
        for (; local_50 != pvVar6; local_50 = local_50 + 1) {
          TVar10 = filterFirstOrderHighPass(&pDVar4->filterCoefficients,*local_50);
          *local_50 = TVar10;
        }
      }
      else if (EVar1 == SecondOrderButterworthHighPass) {
        local_70 = std::array<float,_512UL>::begin((array<float,_512UL> *)0x1b0f20);
        pvVar6 = std::array<float,_512UL>::end((array<float,_512UL> *)0x1b0f2f);
        for (; local_70 != pvVar6; local_70 = local_70 + 1) {
          TVar10 = filterSecondOrderButterworthHighPass(&pDVar4->filterCoefficients,*local_70);
          *local_70 = TVar10;
        }
      }
    }
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    for (local_8c = 0; local_8c < pDVar4->nRecords; local_8c = local_8c + 1) {
      std::
      array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
      ::operator[]((array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
                    *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (size_type)in_stack_ffffffffffffff28);
      pvVar7 = std::array<int,_16UL>::operator[]
                         ((array<int,_16UL> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (size_type)in_stack_ffffffffffffff28);
      if (0 < *pvVar7) {
        std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>::push_back
                  ((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
        iVar9 = *pvVar7;
        *pvVar7 = iVar9 + -1;
        if (iVar9 + -1 == 0) {
          bVar2 = std::function::operator_cast_to_bool
                            ((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                              *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          if (bVar2) {
            std::
            function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
            ::operator()((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                          *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                          *)in_stack_ffffffffffffff28);
          }
          std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>::clear
                    ((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *
                     )0x1b108c);
          local_b0 = local_8c;
          while (local_b0 = local_b0 + 1, local_b0 < pDVar4->nRecords) {
            in_stack_ffffffffffffff38 =
                 (value_type *)
                 std::
                 array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
                 ::operator[]((array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
                               *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              (size_type)in_stack_ffffffffffffff28);
            std::
            array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
            ::operator[]((array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
                          *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (size_type)in_stack_ffffffffffffff28);
            std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>::
            operator=((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      (vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                       *)in_stack_ffffffffffffff38);
            pvVar7 = std::array<int,_16UL>::operator[]
                               ((array<int,_16UL> *)
                                CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                (size_type)in_stack_ffffffffffffff28);
            in_stack_ffffffffffffff44 = *pvVar7;
            pvVar7 = std::array<int,_16UL>::operator[]
                               ((array<int,_16UL> *)
                                CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                (size_type)in_stack_ffffffffffffff28);
            *pvVar7 = in_stack_ffffffffffffff44;
          }
          pDVar4->nRecords = pDVar4->nRecords + -1;
          local_8c = local_8c + -1;
        }
      }
    }
    iVar9 = pDVar4->bufferId + 1;
    pDVar4->bufferId = iVar9;
    sVar8 = std::array<std::array<float,_512UL>,_939UL>::size(&pDVar4->buffer);
    if ((int)sVar8 <= iVar9) {
      pDVar4->bufferId = 0;
    }
    local_1 = true;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b11d3);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AudioLogger::addFrame(const Sample * stream) {
    auto & data = getData();

    if (data.isReady == false) return false;

	if (SDL_GetQueuedAudioSize(data.deviceIdIn) > 32*sizeof(float)*kSamplesPerFrame) {
		printf("Queue size: %d\n", SDL_GetQueuedAudioSize(data.deviceIdIn));
		SDL_ClearQueuedAudio(data.deviceIdIn);
	}

    const float norm = 1.0/data.parameters.nChannels;

    auto & curFrame = data.buffer[data.bufferId];

    for (int i = 0; i < kSamplesPerFrame; ++i) {
        Sample x = 0;
        for (int j = 0; j < data.parameters.nChannels; ++j) {
            x += stream[i*data.parameters.nChannels + j];
        }
        curFrame[i] = x*norm;
    }

    switch (data.parameters.filter) {
        case EAudioFilter::None:
            {
            }
            break;
        case EAudioFilter::FirstOrderHighPass:
            {
                for (auto & s : curFrame) {
                    s = ::filterFirstOrderHighPass(data.filterCoefficients, s);
                }
            }
            break;
        case EAudioFilter::SecondOrderButterworthHighPass:
            {
                for (auto & s : curFrame) {
                    s = ::filterSecondOrderButterworthHighPass(data.filterCoefficients, s);
                }
            }
            break;
    }

    std::lock_guard<std::mutex> lock(data.mutex);

    for (int r = 0; r < data.nRecords; ++r) {
        auto & record = data.records[r];
        auto & nFramesToRecord = data.nFramesToRecord[r];

        if (nFramesToRecord > 0) {
            record.push_back(curFrame);
            if (--nFramesToRecord == 0) {
                if (data.parameters.callback) data.parameters.callback(record);
                record.clear();

                for (int k = r + 1; k < data.nRecords; ++k) {
                    data.records[k - 1] = std::move(data.records[k]);
                    data.nFramesToRecord[k - 1] = data.nFramesToRecord[k];
                }
                --data.nRecords;
                --r;
            }
        }
    }

    if (++data.bufferId >= (int) data.buffer.size()) {
        data.bufferId = 0;
    }

    return true;
}